

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_RECALL(effect_handler_context_t_conflict *context)

{
  uint32_t *puVar1;
  _Bool _Var2;
  short sVar3;
  int16_t iVar4;
  wchar_t level;
  uint32_t uVar5;
  char *fmt;
  player *ppVar6;
  
  context->ident = true;
  if (((((player->opts).opt[0x21] == true) && (player->total_winner == 0)) ||
      (((player->opts).opt[0x20] == true && (_Var2 = is_quest(player,(int)player->depth), _Var2))))
     || (player->upkeep->arena_level == true)) {
    msg("Nothing happens.");
    return true;
  }
  level = dungeon_get_next_level(player,(int)player->max_depth,L'\x01');
  if (((((player->opts).opt[0x20] == true) && (player->depth == 0)) &&
      (_Var2 = is_quest(player,level), _Var2)) &&
     (_Var2 = get_check("Are you sure you want to descend? "), !_Var2)) {
    return false;
  }
  if (player->word_recall != 0) {
    _Var2 = get_check("Word of Recall is already active.  Do you want to cancel it? ");
    iVar4 = 0;
    if (!_Var2) {
      return false;
    }
    fmt = "A tension leaves the air around you...";
    goto LAB_0013d78a;
  }
  if (player->depth < 1) {
    if (((player->opts).opt[0x2b] == true) && (_Var2 = player_get_recall_depth(player), !_Var2)) {
      return false;
    }
  }
  else {
    sVar3 = player->max_depth;
    ppVar6 = player;
    if ((player->depth != sVar3) && ((player->opts).opt[0x2b] == false)) {
      _Var2 = get_check("Set recall depth to current depth? ");
      ppVar6 = player;
      if (!_Var2) goto LAB_0013d776;
      sVar3 = player->depth;
      player->max_depth = sVar3;
    }
    ppVar6->recall_depth = sVar3;
  }
LAB_0013d776:
  uVar5 = Rand_div(0x14);
  iVar4 = (short)uVar5 + 0xf;
  fmt = "The air about you becomes charged...";
LAB_0013d78a:
  player->word_recall = iVar4;
  msg(fmt);
  ppVar6 = player;
  puVar1 = &player->upkeep->redraw;
  *puVar1 = *puVar1 | 0x2000;
  handle_stuff(ppVar6);
  return true;
}

Assistant:

bool effect_handler_RECALL(effect_handler_context_t *context)
{
	int target_depth;
	context->ident = true;

	/* No recall */
	if (OPT(player, birth_no_recall) && !player->total_winner) {
		msg("Nothing happens.");
		return true;
	}

	/* No recall from quest levels with force_descend */
	if (OPT(player, birth_force_descend)
			&& is_quest(player, player->depth)) {
		msg("Nothing happens.");
		return true;
	}

	/* No recall from single combat */
	if (player->upkeep->arena_level) {
		msg("Nothing happens.");
		return true;
	}

	/* Warn the player if they're descending to an unrecallable level */
	target_depth = dungeon_get_next_level(player, player->max_depth, 1);
	if (OPT(player, birth_force_descend) && !(player->depth)
			&& is_quest(player, target_depth)) {
		if (!get_check("Are you sure you want to descend? ")) {
			return false;
		}
	}

	/* Activate recall */
	if (!player->word_recall) {
		/* Reset recall depth */
		if (player->depth > 0) {
			if (player->depth != player->max_depth
					&& !OPT(player, birth_levels_persist)) {
				if (get_check("Set recall depth to current depth? ")) {
					player->recall_depth = player->max_depth = player->depth;
				}
			} else {
				player->recall_depth = player->max_depth;
			}
		} else {
			if (OPT(player, birth_levels_persist)) {
				/* Persistent levels players get to choose */
				if (!player_get_recall_depth(player)) return false;
			}
		}

		player->word_recall = randint0(20) + 15;
		msg("The air about you becomes charged...");
	} else {
		/* Deactivate recall */
		if (!get_check("Word of Recall is already active.  Do you want to cancel it? "))
			return false;

		player->word_recall = 0;
		msg("A tension leaves the air around you...");
	}

	/* Redraw status line */
	player->upkeep->redraw |= PR_STATUS;
	handle_stuff(player);

	return true;
}